

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlanner.cpp
# Opt level: O0

void __thiscall
GeneralizedMAAStarPlanner::~GeneralizedMAAStarPlanner(GeneralizedMAAStarPlanner *this)

{
  TimedAlgorithm *in_RDI;
  vector<BayesianGameForDecPOMDPStage_*,_std::allocator<BayesianGameForDecPOMDPStage_*>_>
  *unaff_retaddr;
  
  in_RDI->_vptr_TimedAlgorithm = (_func_int **)&PTR__GeneralizedMAAStarPlanner_00d12790;
  std::vector<BayesianGameForDecPOMDPStage_*,_std::allocator<BayesianGameForDecPOMDPStage_*>_>::
  ~vector(unaff_retaddr);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::__cxx11::string::~string((string *)&in_RDI[5]._m_timer);
  boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x95ff1c);
  TimedAlgorithm::~TimedAlgorithm(in_RDI);
  return;
}

Assistant:

GeneralizedMAAStarPlanner::~GeneralizedMAAStarPlanner()
{
}